

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

void __thiscall
license::Project::exportPublicKey
          (Project *this,string *include_folder,
          unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
          *cryptoHelper)

{
  reference pvVar1;
  Environment env;
  json data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pkey;
  Template temp;
  path templates_path;
  allocator local_f9;
  unique_ptr<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_> local_f8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_a8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_98;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_88;
  Template local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)&this->m_templates_folder);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                 &local_40,"/");
  std::operator+(&local_e0,include_folder,"/");
  inja::Environment::Environment((Environment *)&local_f8,(string *)&local_78,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_e0,"public_key.inja",(allocator *)&local_c0);
  inja::Environment::parse_template(&local_78,(Environment *)&local_f8,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_f0,(nullptr_t)0x0);
  (*((cryptoHelper->_M_t).
     super___uniq_ptr_impl<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>._M_t.
     super__Tuple_impl<0UL,_license::CryptoHelper_*,_std::default_delete<license::CryptoHelper>_>.
     super__Head_base<0UL,_license::CryptoHelper_*,_false>._M_head_impl)->_vptr_CryptoHelper[2])
            (&local_c0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  basic_json<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_0>
            (&local_88,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0);
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&local_f0,"public_key");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=(pvVar1,&local_88);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_88);
  local_e0._M_dataplus._M_p =
       (pointer)(local_c0._M_impl.super__Vector_impl_data._M_finish +
                -(long)local_c0._M_impl.super__Vector_impl_data._M_start);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json<unsigned_long,_unsigned_long,_0>(&local_98,(unsigned_long *)&local_e0);
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&local_f0,"public_key_len");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=(pvVar1,&local_98);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_98);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_a8,&this->m_name);
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&local_f0,"product_name");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=(pvVar1,&local_a8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_a8);
  std::__cxx11::string::string((string *)&local_e0,"public_key.h",&local_f9);
  inja::Environment::write((Environment *)&local_f8,(int)&local_78,&local_f0,(size_t)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_f0);
  inja::Template::~Template(&local_78);
  std::unique_ptr<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>::
  ~unique_ptr(&local_f8);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Project::exportPublicKey(const std::string &include_folder, const std::unique_ptr<CryptoHelper> &cryptoHelper) {
	const fs::path templates_path(m_templates_folder);
	Environment env(templates_path.string() + "/", include_folder + "/");
	Template temp = env.parse_template(TEMPLATE);
	json data;
	const vector<unsigned char> pkey = cryptoHelper->exportPublicKey();
	data["public_key"] = pkey;
	data["public_key_len"] = pkey.size();
	data["product_name"] = m_name;
	env.write(temp, data, PUBLIC_KEY_INC_FNAME);
}